

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simpletz.cpp
# Opt level: O1

void __thiscall
icu_63::SimpleTimeZone::setStartRule
          (SimpleTimeZone *this,int32_t month,int32_t dayOfWeekInMonth,int32_t dayOfWeek,
          int32_t time,TimeMode mode,UErrorCode *status)

{
  this->startMonth = (int8_t)month;
  this->startDay = (int8_t)dayOfWeekInMonth;
  this->startDayOfWeek = (int8_t)dayOfWeek;
  this->startTime = time;
  this->startTimeMode = mode;
  decodeStartRule(this,status);
  this->transitionRulesInitialized = '\0';
  return;
}

Assistant:

void
SimpleTimeZone::setStartRule(int32_t month, int32_t dayOfWeekInMonth, int32_t dayOfWeek,
                             int32_t time, TimeMode mode, UErrorCode& status)
{
    startMonth     = (int8_t)month;
    startDay       = (int8_t)dayOfWeekInMonth;
    startDayOfWeek = (int8_t)dayOfWeek;
    startTime      = time;
    startTimeMode  = mode;
    decodeStartRule(status);
    transitionRulesInitialized = FALSE;
}